

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O3

void __thiscall Imf_2_5::TiledOutputFile::~TiledOutputFile(TiledOutputFile *this)

{
  pthread_mutex_t *__mutex;
  OStream *pOVar1;
  int iVar2;
  undefined4 extraout_var;
  Data *this_00;
  
  (this->super_GenericOutputFile)._vptr_GenericOutputFile =
       (_func_int **)&PTR__TiledOutputFile_0049d9d8;
  if (this->_data == (Data *)0x0) goto LAB_001e4c29;
  __mutex = (pthread_mutex_t *)this->_streamData;
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  iVar2 = (*this->_streamData->os->_vptr_OStream[3])();
  if (this->_data->tileOffsetsPosition != 0) {
    (*this->_streamData->os->_vptr_OStream[4])();
    TileOffsets::writeTo(&this->_data->tileOffsets,this->_streamData->os);
    pOVar1 = this->_streamData->os;
    (*pOVar1->_vptr_OStream[4])(pOVar1,CONCAT44(extraout_var,iVar2));
  }
  pthread_mutex_unlock(__mutex);
  if (((this->_deleteStream == true) && (this->_streamData != (OutputStreamMutex *)0x0)) &&
     (pOVar1 = this->_streamData->os, pOVar1 != (OStream *)0x0)) {
    (*pOVar1->_vptr_OStream[1])();
  }
  this_00 = this->_data;
  if (this_00->partNumber == -1) {
    operator_delete(this->_streamData,0x38);
    this_00 = this->_data;
    if (this_00 != (Data *)0x0) goto LAB_001e4c14;
    this_00 = (Data *)0x0;
  }
  else {
LAB_001e4c14:
    Data::~Data(this_00);
  }
  operator_delete(this_00,0x178);
LAB_001e4c29:
  GenericOutputFile::~GenericOutputFile(&this->super_GenericOutputFile);
  return;
}

Assistant:

TiledOutputFile::~TiledOutputFile ()
{
    if (_data)
    {
        {
            Lock lock(*_streamData);
            Int64 originalPosition = _streamData->os->tellp();

            if (_data->tileOffsetsPosition > 0)
            {
                try
                {
                    _streamData->os->seekp (_data->tileOffsetsPosition);
                    _data->tileOffsets.writeTo (*_streamData->os);

                    //
                    // Restore the original position.
                    //
                    _streamData->os->seekp (originalPosition);
                }
                catch (...) //NOSONAR - suppress vulnerability reports from SonarCloud.
                {
                    //
                    // We cannot safely throw any exceptions from here.
                    // This destructor may have been called because the
                    // stack is currently being unwound for another
                    // exception.
                    //
                }
            }
        }
        
        if (_deleteStream && _streamData)
            delete _streamData->os;

        if (_data->partNumber == -1)
            delete _streamData;

        delete _data;
    }
}